

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O0

void tinyformat::format<std::__cxx11::string,unsigned_int,unsigned_long,unsigned_long,unsigned_int>
               (ostream *out,char *fmt,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,uint *args_1,
               unsigned_long *args_2,unsigned_long *args_3,uint *args_4)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  uint *in_RSI;
  FormatListRef in_RDI;
  uint *in_R8;
  unsigned_long *in_R9;
  long in_FS_OFFSET;
  ostream *out_00;
  ostream local_90 [136];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  out_00 = local_90;
  makeFormatList<std::__cxx11::string,unsigned_int,unsigned_long,unsigned_long,unsigned_int>
            (in_RCX,in_R8,in_R9,(unsigned_long *)out_00,in_RSI);
  vformat(out_00,(char *)in_RSI,in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void format(std::ostream& out, const char* fmt, const Args&... args)
{
    vformat(out, fmt, makeFormatList(args...));
}